

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O2

char * tabexpand(char *sbuf)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *__s;
  char *pcVar5;
  char buf [256];
  
  cVar1 = *sbuf;
  if (cVar1 == '\0') {
    return sbuf;
  }
  pcVar5 = sbuf + 1;
  iVar3 = 0;
  __s = buf;
  do {
    if (cVar1 == '\t') {
      uVar2 = (uint)(byte)((byte)iVar3 ^ 7);
      uVar4 = (ulong)(uVar2 & 7);
      memset(__s,0x20,uVar4 + 1);
      __s = __s + uVar4;
      iVar3 = iVar3 + (uVar2 & 7);
    }
    else {
      if (cVar1 == '\0') {
        *__s = '\0';
        strcpy(sbuf,buf);
        return sbuf;
      }
      *__s = cVar1;
    }
    iVar3 = iVar3 + 1;
    __s = __s + 1;
    cVar1 = *pcVar5;
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

char *tabexpand(char *sbuf)	/* expand tabs into proper number of spaces */
{
    char buf[BUFSZ];
    char *bp, *s = sbuf;
    int idx;

    if (!*s) return sbuf;

    /* warning: no bounds checking performed */
    for (bp = buf, idx = 0; *s; s++)
	if (*s == '\t') {
	    do *bp++ = ' '; while (++idx % 8);
	} else {
	    *bp++ = *s;
	    idx++;
	}
    *bp = 0;
    return strcpy(sbuf, buf);
}